

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickle_event.c
# Opt level: O0

PickleEvent * PickleEvent_new(Pickle *pickle)

{
  PickleEvent *pPVar1;
  PickleEvent *pickle_event;
  Pickle *pickle_local;
  
  pPVar1 = (PickleEvent *)malloc(0x28);
  (pPVar1->event).event_delete = PickleEvent_delete;
  (pPVar1->event).event_print = PickleEvent_print;
  (pPVar1->event).event_type = Gherkin_PickleEvent;
  pPVar1->pickle = pickle;
  return pPVar1;
}

Assistant:

const PickleEvent* PickleEvent_new(const Pickle* pickle) {
    PickleEvent* pickle_event = (PickleEvent*)malloc(sizeof(PickleEvent));
    pickle_event->event.event_delete = &PickleEvent_delete;
    pickle_event->event.event_print = &PickleEvent_print;
    pickle_event->event.event_type = Gherkin_PickleEvent;
    pickle_event->pickle = pickle;
    return pickle_event;
}